

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eval_f.c
# Opt level: O0

int fits_parser_allocateCol(ParseData *lParse,int nCol,int *status)

{
  void *pvVar1;
  undefined4 *in_RDX;
  int in_ESI;
  size_t in_RDI;
  undefined4 in_stack_ffffffffffffffe8;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  
  if (in_ESI % 0x19 == 0) {
    pvVar1 = fits_recalloc((void *)CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),
                           in_RDI,CONCAT44(in_ESI,in_stack_ffffffffffffffe8),(size_t)in_RDX);
    *(void **)(in_RDI + 0xa0) = pvVar1;
    pvVar1 = fits_recalloc((void *)CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),
                           in_RDI,CONCAT44(in_ESI,in_stack_ffffffffffffffe8),(size_t)in_RDX);
    *(void **)(in_RDI + 0xa8) = pvVar1;
    memset((void *)(*(long *)(in_RDI + 0xa0) + (long)in_ESI * 0x110),0,0x1a90);
    memset((void *)(*(long *)(in_RDI + 0xa8) + (long)in_ESI * 0xa0),0,4000);
    if ((*(long *)(in_RDI + 0xa0) == 0) || (*(long *)(in_RDI + 0xa8) == 0)) {
      if (*(long *)(in_RDI + 0xa0) != 0) {
        free(*(void **)(in_RDI + 0xa0));
      }
      if (*(long *)(in_RDI + 0xa8) != 0) {
        free(*(void **)(in_RDI + 0xa8));
      }
      *(undefined8 *)(in_RDI + 0xa0) = 0;
      *(undefined8 *)(in_RDI + 0xa8) = 0;
      *in_RDX = 0x71;
      return 0x71;
    }
  }
  *(undefined8 *)(*(long *)(in_RDI + 0xa8) + (long)in_ESI * 0xa0 + 0x98) = 0;
  *(undefined8 *)(*(long *)(in_RDI + 0xa8) + (long)in_ESI * 0xa0 + 0x90) = 0;
  return 0;
}

Assistant:

int fits_parser_allocateCol( ParseData *lParse, int nCol, int *status )
{
   if( (nCol%25)==0 ) {
     lParse->colData = (iteratorCol*) fits_recalloc( lParse->colData,
						     nCol, nCol+25,
						     sizeof(iteratorCol) );
     lParse->varData = (DataInfo   *) fits_recalloc( lParse->varData,
						     nCol, nCol+25,
						     sizeof(DataInfo) );

     memset( (lParse->colData + nCol), 0x00, sizeof(iteratorCol)*25 );
     memset( (lParse->varData + nCol), 0x00, sizeof(DataInfo)*25    );

     if(    lParse->colData  == NULL
	    || lParse->varData  == NULL    ) {
         if( lParse->colData  ) free(lParse->colData);
         if( lParse->varData  ) free(lParse->varData);
         lParse->colData = NULL;
         lParse->varData = NULL;
         return( *status = MEMORY_ALLOCATION );
     }
   }
   lParse->varData[nCol].data  = NULL;
   lParse->varData[nCol].undef = NULL;
   return 0;
}